

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdDecomposeLevel
              (word *pTruth,int nVarsInit,int fSplitPrime,int fWriteTruth,char *pRes,int *pVarLevels
              )

{
  char *p;
  char cVar1;
  int iVar2;
  int iVar3;
  Dau_Dsd_t P;
  
  P.nSizeNonDec = 0;
  iVar2 = 1 << ((char)nVarsInit - 6U & 0x1f);
  if (nVarsInit < 7) {
    iVar2 = 1;
  }
  P.fSplitPrime = fSplitPrime;
  P.fWriteTruth = fWriteTruth;
  P.pVarLevels = pVarLevels;
  if ((*pTruth & 1) == 0) {
    iVar2 = Abc_TtIsConst0(pTruth,iVar2);
    if (iVar2 == 0) {
LAB_004318b1:
      iVar2 = Dau_DsdDecomposeInt(&P,pTruth,nVarsInit);
      p = P.pOutput;
      Dau_DsdComputeMatches(p);
      Dau_DsdRemoveBraces(p,Dau_DsdComputeMatches::pMatches);
      if (pRes != (char *)0x0) {
        strcpy(pRes,p);
      }
      if (iVar2 == 1 && fSplitPrime == 0) {
        __assert_fail("fSplitPrime || Status != 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                      ,0x7a1,"int Dau_DsdDecomposeLevel(word *, int, int, int, char *, int *)");
      }
      iVar3 = -1;
      if (iVar2 != 2) {
        iVar3 = P.nSizeNonDec;
      }
      if (fSplitPrime != 0) {
        return iVar3;
      }
      return P.nSizeNonDec;
    }
    cVar1 = '0';
  }
  else {
    iVar2 = Abc_TtIsConst1(pTruth,iVar2);
    if (iVar2 == 0) goto LAB_004318b1;
    cVar1 = '1';
  }
  if (pRes != (char *)0x0) {
    *pRes = cVar1;
    pRes[1] = '\0';
  }
  return 0;
}

Assistant:

int Dau_DsdDecomposeLevel( word * pTruth, int nVarsInit, int fSplitPrime, int fWriteTruth, char * pRes, int * pVarLevels )
{
    Dau_Dsd_t P, * p = &P;
    p->fSplitPrime = fSplitPrime;
    p->fWriteTruth = fWriteTruth;
    p->pVarLevels  = pVarLevels;
    p->nSizeNonDec = 0;
    if ( (pTruth[0] & 1) == 0 && Abc_TtIsConst0(pTruth, Abc_TtWordNum(nVarsInit)) )
        { if ( pRes ) pRes[0] = '0', pRes[1] = 0; }
    else if ( (pTruth[0] & 1) && Abc_TtIsConst1(pTruth, Abc_TtWordNum(nVarsInit)) )
        { if ( pRes ) pRes[0] = '1', pRes[1] = 0; }
    else 
    {
        int Status = Dau_DsdDecomposeInt( p, pTruth, nVarsInit );
        Dau_DsdRemoveBraces( p->pOutput, Dau_DsdComputeMatches(p->pOutput) );
        if ( pRes )
            strcpy( pRes, p->pOutput );
        assert( fSplitPrime || Status != 1 );
        if ( fSplitPrime && Status == 2 )
            return -1;
    }
//    assert( p->nSizeNonDec == 0 );
    return p->nSizeNonDec;
}